

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_attribute.cpp
# Opt level: O0

adios2_error adios2_attribute_data(void *data,size_t *size,adios2_attribute *attribute)

{
  double dVar1;
  DataType DVar2;
  DataType DVar3;
  ulong uVar4;
  long lVar5;
  const_reference pvVar6;
  double *pdVar7;
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  longdouble *dataT_13;
  Attribute<long_double> *attributeCpp_12;
  double *dataT_12;
  Attribute<double> *attributeCpp_11;
  float *dataT_11;
  Attribute<float> *attributeCpp_10;
  uint64_t *dataT_10;
  Attribute<unsigned_long> *attributeCpp_9;
  uint32_t *dataT_9;
  Attribute<unsigned_int> *attributeCpp_8;
  uint16_t *dataT_8;
  Attribute<unsigned_short> *attributeCpp_7;
  uint8_t *dataT_7;
  Attribute<unsigned_char> *attributeCpp_6;
  int64_t *dataT_6;
  Attribute<long> *attributeCpp_5;
  int32_t *dataT_5;
  Attribute<int> *attributeCpp_4;
  int16_t *dataT_4;
  Attribute<short> *attributeCpp_3;
  int8_t *dataT_3;
  Attribute<signed_char> *attributeCpp_2;
  char *dataT_2;
  Attribute<char> *attributeCpp_1;
  size_t e;
  char **dataT_1;
  char *dataT;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *attributeCpp;
  DataType type;
  AttributeBase *attributeBase;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  long local_3f0;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  DataType DVar8;
  __normal_iterator<const_long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  in_stack_fffffffffffffc28;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<const_long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  in_stack_fffffffffffffc30;
  long local_3c0;
  long local_3a8;
  long local_390;
  long local_378;
  long local_360;
  long local_348;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  adios2_attribute *in_stack_fffffffffffffcd0;
  long local_318;
  long local_300;
  long local_2e8;
  long local_290;
  double local_b0;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  double *local_20;
  double *local_18;
  double *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"in call to adios2_attribute_data",&local_41);
  adios2::helper::CheckForNullptr<adios2_attribute_const>
            (in_stack_fffffffffffffcd0,
             (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"for data, in call to adios2_attribute_data",&local_79);
  adios2::helper::CheckForNullptr<void>
            (in_stack_fffffffffffffcd0,
             (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  DVar8 = *(DataType *)(local_20 + 5);
  if (DVar8 != None) {
    DVar2 = adios2::helper::GetDataType<std::__cxx11::string>();
    if (DVar8 == DVar2) {
      if (local_20 == (double *)0x0) {
        local_290 = 0;
      }
      else {
        local_290 = __dynamic_cast(local_20,&adios2::core::AttributeBase::typeinfo,
                                   &adios2::core::Attribute<std::__cxx11::string>::typeinfo,0);
      }
      if ((*(byte *)(local_290 + 0x38) & 1) == 0) {
        *local_18 = *(double *)(local_290 + 0x30);
        for (local_b0 = 0.0; (ulong)local_b0 < (ulong)*local_18;
            local_b0 = (double)((long)local_b0 + 1)) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(local_290 + 0x40),(size_type)local_b0);
          dVar1 = local_10[(long)local_b0];
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_290 + 0x40),(size_type)local_b0);
          uVar4 = std::__cxx11::string::size();
          std::__cxx11::string::copy((char *)pvVar6,(ulong)dVar1,uVar4);
          dVar1 = local_10[(long)local_b0];
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_290 + 0x40),(size_type)local_b0);
          lVar5 = std::__cxx11::string::size();
          *(undefined1 *)((long)dVar1 + lVar5) = 0;
        }
      }
      else {
        uVar4 = std::__cxx11::string::size();
        std::__cxx11::string::copy((char *)(local_290 + 0x58),(ulong)local_10,uVar4);
        lVar5 = std::__cxx11::string::size();
        *(undefined1 *)((long)local_10 + lVar5) = 0;
        *local_18 = 4.94065645841247e-324;
      }
    }
    else {
      DVar2 = adios2::helper::GetDataType<char>();
      if (DVar8 == DVar2) {
        if (local_20 == (double *)0x0) {
          local_2e8 = 0;
        }
        else {
          local_2e8 = __dynamic_cast(local_20,&adios2::core::AttributeBase::typeinfo,
                                     &adios2::core::Attribute<char>::typeinfo,0);
        }
        if ((*(byte *)(local_2e8 + 0x38) & 1) == 0) {
          std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffc08);
          std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffc08);
          std::
          copy<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char*>
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     in_stack_fffffffffffffc30._M_current,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     in_stack_fffffffffffffc28._M_current,
                     (char *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
          *local_18 = *(double *)(local_2e8 + 0x30);
        }
        else {
          *(undefined1 *)local_10 = *(undefined1 *)(local_2e8 + 0x58);
          *local_18 = 4.94065645841247e-324;
        }
      }
      else {
        DVar2 = adios2::helper::GetDataType<signed_char>();
        if (DVar8 == DVar2) {
          if (local_20 == (double *)0x0) {
            local_300 = 0;
          }
          else {
            local_300 = __dynamic_cast(local_20,&adios2::core::AttributeBase::typeinfo,
                                       &adios2::core::Attribute<signed_char>::typeinfo,0);
          }
          if ((*(byte *)(local_300 + 0x38) & 1) == 0) {
            std::vector<signed_char,_std::allocator<signed_char>_>::begin
                      ((vector<signed_char,_std::allocator<signed_char>_> *)
                       in_stack_fffffffffffffc08);
            std::vector<signed_char,_std::allocator<signed_char>_>::end
                      ((vector<signed_char,_std::allocator<signed_char>_> *)
                       in_stack_fffffffffffffc08);
            std::
            copy<__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>,signed_char*>
                      ((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                        )in_stack_fffffffffffffc30._M_current,
                       (__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                        )in_stack_fffffffffffffc28._M_current,
                       (char *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
            *local_18 = *(double *)(local_300 + 0x30);
          }
          else {
            *(undefined1 *)local_10 = *(undefined1 *)(local_300 + 0x58);
            *local_18 = 4.94065645841247e-324;
          }
        }
        else {
          DVar2 = adios2::helper::GetDataType<short>();
          if (DVar8 == DVar2) {
            if (local_20 == (double *)0x0) {
              local_318 = 0;
            }
            else {
              local_318 = __dynamic_cast(local_20,&adios2::core::AttributeBase::typeinfo,
                                         &adios2::core::Attribute<short>::typeinfo,0);
            }
            if ((*(byte *)(local_318 + 0x38) & 1) == 0) {
              std::vector<short,_std::allocator<short>_>::begin
                        ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffc08);
              std::vector<short,_std::allocator<short>_>::end
                        ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffc08);
              std::
              copy<__gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>,short*>
                        ((__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>
                          )in_stack_fffffffffffffc30._M_current,
                         (__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>
                          )in_stack_fffffffffffffc28._M_current,
                         (short *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
              *local_18 = *(double *)(local_318 + 0x30);
            }
            else {
              *(undefined2 *)local_10 = *(undefined2 *)(local_318 + 0x58);
              *local_18 = 4.94065645841247e-324;
            }
          }
          else {
            DVar2 = adios2::helper::GetDataType<int>();
            if (DVar8 == DVar2) {
              if (local_20 == (double *)0x0) {
                lVar5 = 0;
              }
              else {
                lVar5 = __dynamic_cast(local_20,&adios2::core::AttributeBase::typeinfo,
                                       &adios2::core::Attribute<int>::typeinfo,0);
              }
              if ((*(byte *)(lVar5 + 0x38) & 1) == 0) {
                std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc08);
                std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc08);
                std::
                copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int*>
                          ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                           in_stack_fffffffffffffc30._M_current,
                           (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                           in_stack_fffffffffffffc28._M_current,
                           (int *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
                *local_18 = *(double *)(lVar5 + 0x30);
              }
              else {
                *(undefined4 *)local_10 = *(undefined4 *)(lVar5 + 0x58);
                *local_18 = 4.94065645841247e-324;
              }
            }
            else {
              DVar2 = DVar8;
              DVar3 = adios2::helper::GetDataType<long>();
              if (DVar2 == DVar3) {
                if (local_20 == (double *)0x0) {
                  local_348 = 0;
                }
                else {
                  local_348 = __dynamic_cast(local_20,&adios2::core::AttributeBase::typeinfo,
                                             &adios2::core::Attribute<long>::typeinfo,0);
                }
                if ((*(byte *)(local_348 + 0x38) & 1) == 0) {
                  std::vector<long,_std::allocator<long>_>::begin
                            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc08);
                  std::vector<long,_std::allocator<long>_>::end
                            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc08);
                  std::
                  copy<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,long*>
                            ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                              )in_stack_fffffffffffffc30._M_current,
                             (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                              )in_stack_fffffffffffffc28._M_current,
                             (long *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
                  *local_18 = *(double *)(local_348 + 0x30);
                }
                else {
                  *local_10 = *(double *)(local_348 + 0x58);
                  *local_18 = 4.94065645841247e-324;
                }
              }
              else {
                DVar2 = adios2::helper::GetDataType<unsigned_char>();
                if (DVar8 == DVar2) {
                  if (local_20 == (double *)0x0) {
                    local_360 = 0;
                  }
                  else {
                    local_360 = __dynamic_cast(local_20,&adios2::core::AttributeBase::typeinfo,
                                               &adios2::core::Attribute<unsigned_char>::typeinfo,0);
                  }
                  if ((*(byte *)(local_360 + 0x38) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffc08);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffc08);
                    std::
                    copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )in_stack_fffffffffffffc30._M_current,
                               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )in_stack_fffffffffffffc28._M_current,
                               (uchar *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20
                                                ));
                    *local_18 = *(double *)(local_360 + 0x30);
                  }
                  else {
                    *(undefined1 *)local_10 = *(undefined1 *)(local_360 + 0x58);
                    *local_18 = 4.94065645841247e-324;
                  }
                }
                else {
                  DVar2 = adios2::helper::GetDataType<unsigned_short>();
                  if (DVar8 == DVar2) {
                    if (local_20 == (double *)0x0) {
                      local_378 = 0;
                    }
                    else {
                      local_378 = __dynamic_cast(local_20,&adios2::core::AttributeBase::typeinfo,
                                                 &adios2::core::Attribute<unsigned_short>::typeinfo,
                                                 0);
                    }
                    if ((*(byte *)(local_378 + 0x38) & 1) == 0) {
                      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                 in_stack_fffffffffffffc08);
                      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                 in_stack_fffffffffffffc08);
                      std::
                      copy<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,unsigned_short*>
                                ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                  )in_stack_fffffffffffffc30._M_current,
                                 (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                  )in_stack_fffffffffffffc28._M_current,
                                 (unsigned_short *)
                                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
                      *local_18 = *(double *)(local_378 + 0x30);
                    }
                    else {
                      *(undefined2 *)local_10 = *(undefined2 *)(local_378 + 0x58);
                      *local_18 = 4.94065645841247e-324;
                    }
                  }
                  else {
                    DVar2 = adios2::helper::GetDataType<unsigned_int>();
                    if (DVar8 == DVar2) {
                      if (local_20 == (double *)0x0) {
                        local_390 = 0;
                      }
                      else {
                        local_390 = __dynamic_cast(local_20,&adios2::core::AttributeBase::typeinfo,
                                                   &adios2::core::Attribute<unsigned_int>::typeinfo,
                                                   0);
                      }
                      if ((*(byte *)(local_390 + 0x38) & 1) == 0) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   in_stack_fffffffffffffc08);
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   in_stack_fffffffffffffc08);
                        std::
                        copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
                                  ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    )in_stack_fffffffffffffc30._M_current,
                                   (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    )in_stack_fffffffffffffc28._M_current,
                                   (uint *)CONCAT44(in_stack_fffffffffffffc24,
                                                    in_stack_fffffffffffffc20));
                        *local_18 = *(double *)(local_390 + 0x30);
                      }
                      else {
                        *(undefined4 *)local_10 = *(undefined4 *)(local_390 + 0x58);
                        *local_18 = 4.94065645841247e-324;
                      }
                    }
                    else {
                      DVar2 = adios2::helper::GetDataType<unsigned_long>();
                      if (DVar8 == DVar2) {
                        if (local_20 == (double *)0x0) {
                          local_3a8 = 0;
                        }
                        else {
                          local_3a8 = __dynamic_cast(local_20,&adios2::core::AttributeBase::typeinfo
                                                     ,&adios2::core::Attribute<unsigned_long>::
                                                       typeinfo,0);
                        }
                        if ((*(byte *)(local_3a8 + 0x38) & 1) == 0) {
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_fffffffffffffc08);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_fffffffffffffc08);
                          std::
                          copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      )in_stack_fffffffffffffc30._M_current,
                                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      )in_stack_fffffffffffffc28._M_current,
                                     (unsigned_long *)
                                     CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
                          *local_18 = *(double *)(local_3a8 + 0x30);
                        }
                        else {
                          *local_10 = *(double *)(local_3a8 + 0x58);
                          *local_18 = 4.94065645841247e-324;
                        }
                      }
                      else {
                        DVar2 = adios2::helper::GetDataType<float>();
                        if (DVar8 == DVar2) {
                          if (local_20 == (double *)0x0) {
                            local_3c0 = 0;
                          }
                          else {
                            local_3c0 = __dynamic_cast(local_20,&adios2::core::AttributeBase::
                                                                 typeinfo,
                                                       &adios2::core::Attribute<float>::typeinfo,0);
                          }
                          if ((*(byte *)(local_3c0 + 0x38) & 1) == 0) {
                            std::vector<float,_std::allocator<float>_>::begin
                                      ((vector<float,_std::allocator<float>_> *)
                                       in_stack_fffffffffffffc08);
                            std::vector<float,_std::allocator<float>_>::end
                                      ((vector<float,_std::allocator<float>_> *)
                                       in_stack_fffffffffffffc08);
                            std::
                            copy<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,float*>
                                      ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                                        )in_stack_fffffffffffffc30._M_current,
                                       (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                                        )in_stack_fffffffffffffc28._M_current,
                                       (float *)CONCAT44(in_stack_fffffffffffffc24,
                                                         in_stack_fffffffffffffc20));
                            *local_18 = *(double *)(local_3c0 + 0x30);
                          }
                          else {
                            *(undefined4 *)local_10 = *(undefined4 *)(local_3c0 + 0x58);
                            *local_18 = 4.94065645841247e-324;
                          }
                        }
                        else {
                          DVar2 = adios2::helper::GetDataType<double>();
                          if (DVar8 == DVar2) {
                            if (local_20 == (double *)0x0) {
                              pdVar7 = (double *)0x0;
                            }
                            else {
                              pdVar7 = (double *)
                                       __dynamic_cast(local_20,&adios2::core::AttributeBase::
                                                                typeinfo,
                                                      &adios2::core::Attribute<double>::typeinfo,0);
                            }
                            if (((ulong)pdVar7[7] & 1) == 0) {
                              __last._M_current = pdVar7;
                              std::vector<double,_std::allocator<double>_>::begin
                                        ((vector<double,_std::allocator<double>_> *)
                                         in_stack_fffffffffffffc08);
                              std::vector<double,_std::allocator<double>_>::end
                                        ((vector<double,_std::allocator<double>_> *)
                                         in_stack_fffffffffffffc08);
                              std::
                              copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double*>
                                        ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                          )local_20,__last,
                                         (double *)
                                         CONCAT44(in_stack_fffffffffffffc24,
                                                  in_stack_fffffffffffffc20));
                              *local_18 = pdVar7[6];
                            }
                            else {
                              *local_10 = pdVar7[0xb];
                              *local_18 = 4.94065645841247e-324;
                            }
                          }
                          else {
                            DVar2 = adios2::helper::GetDataType<long_double>();
                            if (DVar8 == DVar2) {
                              if (local_20 == (double *)0x0) {
                                local_3f0 = 0;
                              }
                              else {
                                local_3f0 = __dynamic_cast(local_20,&adios2::core::AttributeBase::
                                                                     typeinfo,
                                                           &adios2::core::Attribute<long_double>::
                                                            typeinfo,0);
                              }
                              if ((*(byte *)(local_3f0 + 0x38) & 1) == 0) {
                                std::vector<long_double,_std::allocator<long_double>_>::begin
                                          ((vector<long_double,_std::allocator<long_double>_> *)
                                           in_stack_fffffffffffffc08);
                                std::vector<long_double,_std::allocator<long_double>_>::end
                                          ((vector<long_double,_std::allocator<long_double>_> *)
                                           in_stack_fffffffffffffc08);
                                std::
                                copy<__gnu_cxx::__normal_iterator<long_double_const*,std::vector<long_double,std::allocator<long_double>>>,long_double*>
                                          (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                                           (longdouble *)CONCAT44(DVar8,in_stack_fffffffffffffc20));
                                *local_18 = *(double *)(local_3f0 + 0x30);
                              }
                              else {
                                *(unkbyte10 *)local_10 = *(unkbyte10 *)(local_3f0 + 0x60);
                                *local_18 = 4.94065645841247e-324;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_attribute_data(void *data, size_t *size, const adios2_attribute *attribute)
{
    try
    {
        adios2::helper::CheckForNullptr(attribute, "in call to adios2_attribute_data");
        adios2::helper::CheckForNullptr(data, "for data, in call to adios2_attribute_data");

        const adios2::core::AttributeBase *attributeBase =
            reinterpret_cast<const adios2::core::AttributeBase *>(attribute);

        const adios2::DataType type(attributeBase->m_Type);

        if (type == adios2::DataType::None)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            const adios2::core::Attribute<std::string> *attributeCpp =
                dynamic_cast<const adios2::core::Attribute<std::string> *>(attributeBase);
            if (attributeCpp->m_IsSingleValue)
            {
                char *dataT = reinterpret_cast<char *>(data);
                attributeCpp->m_DataSingleValue.copy(dataT, attributeCpp->m_DataSingleValue.size());
                dataT[attributeCpp->m_DataSingleValue.size()] = '\0';
                *size = 1;
            }
            else
            {
                *size = attributeCpp->m_Elements;
                char **dataT = reinterpret_cast<char **>(data);

                for (size_t e = 0; e < *size; ++e)
                {
                    attributeCpp->m_DataArray[e].copy(dataT[e],
                                                      attributeCpp->m_DataArray[e].size());
                    dataT[e][attributeCpp->m_DataArray[e].size()] = '\0';
                }
            }
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        const adios2::core::Attribute<T> *attributeCpp =                                           \
            dynamic_cast<const adios2::core::Attribute<T> *>(attributeBase);                       \
        T *dataT = reinterpret_cast<T *>(data);                                                    \
        if (attributeCpp->m_IsSingleValue)                                                         \
        {                                                                                          \
            *dataT = attributeCpp->m_DataSingleValue;                                              \
            *size = 1;                                                                             \
        }                                                                                          \
        else                                                                                       \
        {                                                                                          \
            std::copy(attributeCpp->m_DataArray.begin(), attributeCpp->m_DataArray.end(), dataT);  \
            *size = attributeCpp->m_Elements;                                                      \
        }                                                                                          \
    }
        ADIOS2_FOREACH_ATTRIBUTE_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_attribute_data"));
    }
}